

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O1

Mesh * vera::sphereHalfMesh(Mesh *__return_storage_ptr__,int _resolution,float _radius)

{
  double dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  float fVar9;
  vec2 tcoord;
  float local_78;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_40;
  float local_3c;
  undefined1 local_38 [16];
  
  Mesh::Mesh(__return_storage_ptr__);
  fVar2 = (float)_resolution;
  fVar7 = fVar2 * 0.5;
  local_44 = (float)(_resolution + 1);
  fVar3 = fVar2 + fVar2;
  if (fVar7 < local_44) {
    local_48 = 3.1415927 / (float)_resolution;
    fVar4 = fVar7;
    do {
      local_38._0_4_ = fVar4;
      dVar8 = 3.141592653589793 - (double)(fVar4 * local_48);
      dVar1 = sin(dVar8);
      dVar8 = cos(dVar8);
      local_3c = 1.0 - (float)local_38._0_4_ / fVar2;
      if (0.0 <= fVar3) {
        fVar4 = 0.0;
        do {
          fVar5 = fVar4 * (6.2831855 / fVar3);
          fVar6 = sinf(fVar5);
          local_4c = cosf(fVar5);
          local_4c = local_4c * (float)dVar1;
          local_40.x = fVar4 / fVar3;
          local_54.x = fVar6 * (float)dVar1;
          local_50 = (float)dVar8;
          Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_54);
          local_54.x = local_54.x * _radius;
          local_50 = local_50 * _radius;
          local_4c = local_4c * _radius;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_54);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_40);
          fVar4 = fVar4 + 1.0;
        } while (fVar4 <= fVar3);
      }
      fVar4 = (float)local_38._0_4_ + 1.0;
    } while (fVar4 < local_44);
  }
  if (fVar7 < fVar2) {
    local_38 = ZEXT416((uint)(float)(int)(fVar3 + 1.0));
    local_78 = fVar7;
    do {
      if (0.0 < fVar3) {
        fVar4 = 0.0;
        fVar5 = (local_78 - fVar7) * (float)local_38._0_4_;
        fVar6 = ((local_78 + 1.0) - fVar7) * (float)local_38._0_4_;
        fVar9 = ((local_78 + 0.0) - fVar7) * (float)local_38._0_4_;
        do {
          if (0.0 < local_78) {
            Mesh::addIndex(__return_storage_ptr__,(int)(fVar5 + fVar4));
            Mesh::addIndex(__return_storage_ptr__,(int)(fVar4 + 1.0 + fVar5));
            Mesh::addIndex(__return_storage_ptr__,(int)(fVar6 + fVar4));
          }
          if (local_78 < (float)(_resolution + -1)) {
            Mesh::addIndex(__return_storage_ptr__,(int)(fVar9 + fVar4 + 1.0));
            Mesh::addIndex(__return_storage_ptr__,(int)(fVar4 + 1.0 + fVar6));
            Mesh::addIndex(__return_storage_ptr__,(int)(fVar6 + fVar4));
          }
          fVar4 = fVar4 + 1.0;
        } while (fVar4 < fVar3);
      }
      local_78 = local_78 + 1.0;
    } while (local_78 < fVar2);
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh sphereHalfMesh(int _resolution, float _radius ) {
    Mesh mesh;

    float halfRes = _resolution*.5f;
    float doubleRes = _resolution*2.f;
    float polarInc = PI/(_resolution); // ringAngle
    float azimInc = TAU/(doubleRes); // segAngle //
    
    glm::vec3 vert;
    glm::vec2 tcoord;

    for (float i = halfRes; i < _resolution + 1; i++) {
        float tr = sin( PI-i * polarInc);
        float ny = cos( PI-i * polarInc);
        tcoord.y = 1.f - (i / _resolution);

        for (float j = 0; j <= doubleRes; j++) {

            float nx = tr * sin(j * azimInc);
            float nz = tr * cos(j * azimInc);

            tcoord.x = j / (doubleRes);

            vert = {nx, ny, nz};
            mesh.addNormal(vert);

            vert *= _radius;
            mesh.addVertex(vert);
            mesh.addTexCoord(tcoord);
        }
    }

    int nr = doubleRes+1;
    
    int index1, index2, index3;
    for (float iy = halfRes; iy < _resolution; iy++) {
        for (float ix = 0; ix < doubleRes; ix++) {

            // first tri //
            if (iy > 0) {
                index1 = (iy+0-halfRes) * (nr) + (ix+0);
                index2 = (iy+0-halfRes) * (nr) + (ix+1);
                index3 = (iy+1-halfRes) * (nr) + (ix+0);

                mesh.addIndex(index1);
                mesh.addIndex(index2);
                mesh.addIndex(index3);
            }

            if (iy < _resolution - 1 ) {
                // second tri //
                index1 = (iy+0-halfRes) * (nr) + (ix+1);
                index2 = (iy+1-halfRes) * (nr) + (ix+1);
                index3 = (iy+1-halfRes) * (nr) + (ix+0);

                mesh.addIndex(index1);
                mesh.addIndex(index2);
                mesh.addIndex(index3);

            }
        }
    }
    mesh.computeTangents();

    return mesh;
}